

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_ObjDeriveTfo_rec(Acb_Ntk_t *p,int iObj,Vec_Int_t *vTfo,Vec_Int_t *vRoots,int fFirst)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  if ((iObj < 0) || ((p->vObjTrav).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar1 = p->nObjTravs;
  piVar2 = (p->vObjTrav).pArray;
  iVar5 = piVar2[(uint)iObj];
  iVar4 = iVar1 - iVar5;
  piVar2[(uint)iObj] = iVar1;
  if (iVar1 == iVar5) {
    return;
  }
  if (iVar4 != 2) {
    if (iVar4 != 1) {
      __assert_fail("Diff == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                    ,0x272,
                    "void Acb_ObjDeriveTfo_rec(Acb_Ntk_t *, int, Vec_Int_t *, Vec_Int_t *, int)");
    }
    if (iObj < (p->vFanouts).nSize) {
      lVar6 = 0;
      do {
        pVVar3 = (p->vFanouts).pArray;
        if (pVVar3[(uint)iObj].nSize <= lVar6) goto LAB_003a3af6;
        iVar1 = pVVar3[(uint)iObj].pArray[lVar6];
        if ((long)iVar1 < 1) {
          __assert_fail("i>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                        ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
        }
        if ((p->vObjType).nSize <= iVar1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        if ((p->vObjType).pArray[iVar1] != '\0') {
          if (fFirst != 0) {
            iVar5 = Acb_ObjIsDelayCriticalFanin(p,iVar1,iObj);
            if (iVar5 == 0) goto LAB_003a3abe;
          }
          Acb_ObjDeriveTfo_rec(p,iVar1,vTfo,vRoots,0);
        }
LAB_003a3abe:
        lVar6 = lVar6 + 1;
      } while (iObj < (p->vFanouts).nSize);
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  Vec_IntPush(vRoots,iObj);
LAB_003a3af6:
  Vec_IntPush(vTfo,iObj);
  return;
}

Assistant:

void Acb_ObjDeriveTfo_rec( Acb_Ntk_t * p, int iObj, Vec_Int_t * vTfo, Vec_Int_t * vRoots, int fFirst )
{
    int iFanout, i, Diff = Acb_ObjTravIdDiff(p, iObj);
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    if ( Diff == 2 ) // root
    {
        Vec_IntPush( vRoots, iObj );
        Vec_IntPush( vTfo, iObj );
        return;
    }
    assert( Diff == 1 );
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        if ( !fFirst || Acb_ObjIsDelayCriticalFanin(p, iFanout, iObj) )
            Acb_ObjDeriveTfo_rec( p, iFanout, vTfo, vRoots, 0 );
    Vec_IntPush( vTfo, iObj );
}